

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O3

vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> * __thiscall
duckdb::PhysicalPositionalScan::GetChildren
          (vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>
           *__return_storage_ptr__,PhysicalPositionalScan *this)

{
  pointer *pprVar1;
  pointer prVar2;
  iterator __position;
  reference_wrapper<duckdb::PhysicalOperator> *entry;
  pointer prVar3;
  reference_wrapper<const_duckdb::PhysicalOperator> local_28;
  
  PhysicalOperator::GetChildren(__return_storage_ptr__,&this->super_PhysicalOperator);
  prVar2 = (this->child_tables).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar3 = (this->child_tables).
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_start; prVar3 != prVar2; prVar3 = prVar3 + 1) {
    local_28._M_data = prVar3->_M_data;
    __position._M_current =
         (__return_storage_ptr__->
         super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
         ).
         super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
        ).
        super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                  *)__return_storage_ptr__,__position,&local_28);
    }
    else {
      (__position._M_current)->_M_data = local_28._M_data;
      pprVar1 = &(__return_storage_ptr__->
                 super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<const_reference<PhysicalOperator>> PhysicalPositionalScan::GetChildren() const {
	auto result = PhysicalOperator::GetChildren();
	for (auto &entry : child_tables) {
		result.push_back(entry.get());
	}
	return result;
}